

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heatbath.hpp
# Opt level: O2

size_t bcl::heatbath::
       choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                 (vector<double,_std::allocator<double>_> *weights,int param_2,
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 *eng)

{
  pointer pdVar1;
  size_t i;
  double *pdVar2;
  size_t sVar3;
  size_t sVar4;
  double dVar5;
  result_type_conflict rVar6;
  double dVar7;
  uniform_real_distribution<double> local_18;
  
  local_18._M_param._M_a = 0.0;
  local_18._M_param._M_b = 1.0;
  dVar5 = 0.0;
  for (pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    dVar5 = dVar5 + *pdVar2;
  }
  rVar6 = std::uniform_real_distribution<double>::operator()(&local_18,eng);
  pdVar1 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  dVar7 = 0.0;
  sVar3 = 0;
  while( true ) {
    if (sVar4 == sVar3) {
      return sVar4 - 1;
    }
    dVar7 = dVar7 + pdVar1[sVar3];
    if (dVar5 * rVar6 <= dVar7) break;
    sVar3 = sVar3 + 1;
  }
  return sVar3;
}

Assistant:

static std::size_t choose_next(VEC const& weights, int /* present */, ENGINE& eng){
    std::uniform_real_distribution<> dist;
    double sum = std::accumulate(weights.begin(), weights.end(), 0.0);
    double target = sum * dist(eng);
    sum = 0;
    for (std::size_t i = 0; i < weights.size(); ++i) {
      sum += weights[i];
      if (target <= sum) return i;
    }
    return weights.size() - 1;
  }